

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::Expression::PropagationVisitor::visit<slang::ast::ConditionalExpression>
          (PropagationVisitor *this,ConditionalExpression *expr)

{
  Type *pTVar1;
  bool bVar2;
  bool bVar3;
  Expression *pEVar4;
  SourceLocation loc;
  
  bVar2 = bad(&expr->super_Expression);
  if (bVar2) {
    return &expr->super_Expression;
  }
  pTVar1 = this->newType;
  if (pTVar1->canonical == (Type *)0x0) {
    Type::resolveCanonical(pTVar1);
  }
  if ((pTVar1->canonical->super_Symbol).kind == ErrorType) {
    if (this->newType != (Type *)0x0) {
      (expr->super_Expression).type.ptr = this->newType;
      return &expr->super_Expression;
    }
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x1b,
               "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
              );
  }
  pTVar1 = (expr->super_Expression).type.ptr;
  if (pTVar1 == (Type *)0x0) goto LAB_0025ee92;
  bVar2 = Type::isEquivalent(this->newType,pTVar1);
  pTVar1 = this->newType;
  if (pTVar1->canonical == (Type *)0x0) {
    Type::resolveCanonical(pTVar1);
  }
  bVar2 = !bVar2;
  if ((pTVar1->canonical->super_Symbol).kind == FloatingType) {
    pTVar1 = (expr->super_Expression).type.ptr;
    if (pTVar1 == (Type *)0x0) goto LAB_0025ee92;
    if (pTVar1->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar1);
    }
    if ((pTVar1->canonical->super_Symbol).kind != FloatingType) goto LAB_0025edf4;
  }
  else {
LAB_0025edf4:
    bVar3 = Type::isIntegral(this->newType);
    if (bVar3) {
      pTVar1 = (expr->super_Expression).type.ptr;
      if (pTVar1 == (Type *)0x0) {
LAB_0025ee92:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                  );
      }
      bVar3 = Type::isIntegral(pTVar1);
      if (bVar3) goto LAB_0025ee38;
    }
    pTVar1 = this->newType;
    if (pTVar1->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar1);
    }
    if (((pTVar1->canonical->super_Symbol).kind != StringType) &&
       ((expr->super_Expression).kind != OpenRange)) goto LAB_0025ee4c;
  }
LAB_0025ee38:
  bVar3 = ConditionalExpression::propagateType(expr,this->context,this->newType);
  bVar2 = bVar2 && !bVar3;
LAB_0025ee4c:
  if (!bVar2) {
    return &expr->super_Expression;
  }
  loc = this->assignmentLoc;
  bVar2 = ((ulong)loc & 0xfffffff) == 0;
  if (bVar2) {
    loc = (expr->super_Expression).sourceRange.startLoc;
  }
  pEVar4 = ConversionExpression::makeImplicit
                     (this->context,this->newType,(uint)bVar2,&expr->super_Expression,loc);
  return pEVar4;
}

Assistant:

Expression& visit(T& expr) {
        if (expr.bad())
            return expr;

        if (newType.isError()) {
            expr.type = &newType;
            return expr;
        }

        // If the new type is equivalent to the old type, there's no need for a
        // conversion. Otherwise if both types are integral or both are real, we have to
        // check if the conversion should be pushed further down the tree. Otherwise we
        // should insert the implicit conversion here.
        bool needConversion = !newType.isEquivalent(*expr.type);
        if constexpr (is_detected_v<propagate_t, T, const ASTContext&, const Type&>) {
            if ((newType.isFloating() && expr.type->isFloating()) ||
                (newType.isIntegral() && expr.type->isIntegral()) || newType.isString() ||
                expr.kind == ExpressionKind::OpenRange) {

                if (expr.propagateType(context, newType))
                    needConversion = false;
            }
        }

        Expression* result = &expr;
        if (needConversion) {
            if (assignmentLoc) {
                result = &ConversionExpression::makeImplicit(context, newType,
                                                             ConversionKind::Implicit, expr,
                                                             assignmentLoc);
            }
            else {
                result = &ConversionExpression::makeImplicit(context, newType,
                                                             ConversionKind::Propagated, expr,
                                                             expr.sourceRange.start());
            }
        }

        return *result;
    }